

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBarBuf.c
# Opt level: O0

Abc_Obj_t * Abc_NtkFromBarBufs_rec(Abc_Ntk_t *pNtkNew,Abc_Obj_t *pObj)

{
  Abc_Obj_t *pObj_00;
  int iVar1;
  Abc_Obj_t *pAVar2;
  int local_2c;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj_local;
  Abc_Ntk_t *pNtkNew_local;
  
  if ((pObj->field_6).pTemp == (void *)0x0) {
    Abc_NtkDupObj(pNtkNew,pObj,0);
    for (local_2c = 0; iVar1 = Abc_ObjFaninNum(pObj), local_2c < iVar1; local_2c = local_2c + 1) {
      pAVar2 = Abc_ObjFanin(pObj,local_2c);
      pObj_00 = (pObj->field_6).pCopy;
      pAVar2 = Abc_NtkFromBarBufs_rec(pNtkNew,pAVar2);
      Abc_ObjAddFanin(pObj_00,pAVar2);
    }
    pNtkNew_local = (Abc_Ntk_t *)(pObj->field_6).pCopy;
  }
  else {
    pNtkNew_local = (Abc_Ntk_t *)(pObj->field_6).pCopy;
  }
  return (Abc_Obj_t *)pNtkNew_local;
}

Assistant:

Abc_Obj_t * Abc_NtkFromBarBufs_rec( Abc_Ntk_t * pNtkNew, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanin; 
    int i;
    if ( pObj->pCopy )
        return pObj->pCopy;
    Abc_NtkDupObj( pNtkNew, pObj, 0 );
    Abc_ObjForEachFanin( pObj, pFanin, i )
        Abc_ObjAddFanin( pObj->pCopy, Abc_NtkFromBarBufs_rec(pNtkNew, pFanin) );
    return pObj->pCopy;
}